

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nan.cc
# Opt level: O2

void anon_unknown.dwarf_2681::PrintUsage(ostream *stream)

{
  ostream *poVar1;
  
  std::endl<char,std::char_traits<char>>(stream);
  poVar1 = std::operator<<(stream," nan - find NaN and Infinity values");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(stream);
  poVar1 = std::operator<<(stream,"  usage:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"       nan [ options ] [ infile ] > stdout");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"  options:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"       -h    : print this message");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"  infile:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"       data sequence              (double)[stdin]");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"  stdout:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"       result messages");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(stream);
  poVar1 = std::operator<<(stream," SPTK: version ");
  poVar1 = std::operator<<(poVar1,"4.3");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(stream);
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " nan - find NaN and Infinity values" << std::endl;
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       nan [ options ] [ infile ] > stdout" << std::endl;
  *stream << "  options:" << std::endl;
  *stream << "       -h    : print this message" << std::endl;
  *stream << "  infile:" << std::endl;
  *stream << "       data sequence              (double)[stdin]" << std::endl;
  *stream << "  stdout:" << std::endl;
  *stream << "       result messages" << std::endl;
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}